

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cursor.c
# Opt level: O2

int coda_cursor_get_record_field_available_status
              (coda_cursor_conflict *cursor,long index,int *available)

{
  coda_backend cVar1;
  int iVar2;
  coda_type *pcVar3;
  char *pcVar4;
  undefined8 uVar5;
  
  if ((((cursor == (coda_cursor_conflict *)0x0) || (cursor->n < 1)) ||
      (cursor->product == (coda_product_struct *)0x0)) ||
     (pcVar3 = (coda_type *)cursor->stack[cursor->n - 1].type, pcVar3 == (coda_type *)0x0)) {
    pcVar4 = "invalid cursor argument (%s:%u)";
    uVar5 = 0x820;
  }
  else {
    if (available != (int *)0x0) {
      cVar1 = pcVar3->format;
      if (99 < cVar1) {
        pcVar3 = *(coda_type **)&pcVar3->type_class;
      }
      if (pcVar3->type_class != coda_record_class) {
        pcVar4 = coda_type_get_class_name(pcVar3->type_class);
        coda_set_error(-0x69,"cursor does not refer to a record (current type is %s)",pcVar4);
        return -1;
      }
      if (cVar1 - coda_backend_hdf4 < 4) {
        *available = 1;
        return 0;
      }
      if (coda_backend_binary < cVar1) {
        if (cVar1 == coda_backend_memory) {
          iVar2 = coda_mem_cursor_get_record_field_available_status(cursor,index,available);
          return iVar2;
        }
        if (cVar1 == coda_backend_grib) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor.c"
                        ,0x840,
                        "int coda_cursor_get_record_field_available_status(const coda_cursor *, long, int *)"
                       );
        }
        return 0;
      }
      iVar2 = coda_ascbin_cursor_get_record_field_available_status(cursor,index,available);
      return iVar2;
    }
    pcVar4 = "available argument is NULL (%s:%u)";
    uVar5 = 0x825;
  }
  coda_set_error(-100,pcVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor.c"
                 ,uVar5);
  return -1;
}

Assistant:

LIBCODA_API int coda_cursor_get_record_field_available_status(const coda_cursor *cursor, long index, int *available)
{
    coda_type *type;

    if (cursor == NULL || cursor->n <= 0 || cursor->product == NULL || cursor->stack[cursor->n - 1].type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "invalid cursor argument (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (available == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "available argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    type = coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type);
    if (type->type_class != coda_record_class)
    {
        coda_set_error(CODA_ERROR_INVALID_TYPE, "cursor does not refer to a record (current type is %s)",
                       coda_type_get_class_name(type->type_class));
        return -1;
    }

    switch (cursor->stack[cursor->n - 1].type->backend)
    {
        case coda_backend_ascii:
        case coda_backend_binary:
            return coda_ascbin_cursor_get_record_field_available_status(cursor, index, available);
        case coda_backend_memory:
            return coda_mem_cursor_get_record_field_available_status(cursor, index, available);
        case coda_backend_hdf4:
        case coda_backend_hdf5:
        case coda_backend_cdf:
        case coda_backend_netcdf:
            /* fields are always available */
            *available = 1;
            break;
        case coda_backend_grib:
            assert(0);
            exit(1);
    }

    return 0;
}